

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O1

BaseStatistics * duckdb::StructStats::GetChildStats(BaseStatistics *stats)

{
  StatisticsType SVar1;
  InternalException *this;
  string local_40;
  
  SVar1 = BaseStatistics::GetStatsType(&stats->type);
  if (SVar1 == STRUCT_STATS) {
    return (stats->child_stats).
           super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Calling StructStats::GetChildStats on stats that is not a struct",
             "");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const BaseStatistics *StructStats::GetChildStats(const BaseStatistics &stats) {
	if (stats.GetStatsType() != StatisticsType::STRUCT_STATS) {
		throw InternalException("Calling StructStats::GetChildStats on stats that is not a struct");
	}
	return stats.child_stats.get();
}